

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_check_circmod(lys_module *module,char *value,int type)

{
  int iVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = (char *)CONCAT44(in_register_00000014,type);
  iVar1 = 0;
  if (value == pcVar2) {
LAB_001267bb:
    ly_vlog((uint)(in_ECX == 0) + LYE_CIRC_IMPORTS,LY_VLOG_NONE,(void *)0x0,pcVar2);
    iVar1 = -1;
  }
  else if ((ulong)*(byte *)&module[0x8c].dsc != 0) {
    uVar3 = 0;
    do {
      if (*(char **)(*(long *)(module[0x8c].name + uVar3 * 8) + 8) == pcVar2) goto LAB_001267bb;
      uVar3 = uVar3 + 1;
    } while (*(byte *)&module[0x8c].dsc != uVar3);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
lyp_check_circmod(struct lys_module *module, const char *value, int type)
{
    LY_ECODE code = type ? LYE_CIRC_IMPORTS : LYE_CIRC_INCLUDES;
    struct ly_modules_list *models = &module->ctx->models;
    uint8_t i;

    /* include/import itself */
    if (ly_strequal(module->name, value, 1)) {
        LOGVAL(code, LY_VLOG_NONE, NULL, value);
        return -1;
    }

    /* currently parsed modules */
    for (i = 0; i < models->parsing_sub_modules_count; i++) {
        if (ly_strequal(models->parsing_sub_modules[i]->name, value, 1)) {
            LOGVAL(code, LY_VLOG_NONE, NULL, value);
            return -1;
        }
    }

    return 0;
}